

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

int av1_apply_selfguided_restoration_c
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  int iVar1;
  int iVar2;
  undefined2 uVar3;
  undefined2 *puVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  ushort *puVar12;
  uint uVar13;
  uint local_8c;
  uint8_t *local_80;
  undefined2 *local_78;
  ushort *local_70;
  
  av1_selfguided_restoration_c
            (dat8,width,height,stride,tmpbuf,tmpbuf + 0x27734,width,eps,bit_depth,highbd);
  iVar1 = av1_sgr_params[eps].r[0];
  if (iVar1 == 0) {
    iVar7 = 0x80 - xqd[1];
    iVar5 = 0;
  }
  else {
    iVar5 = *xqd;
    if (av1_sgr_params[eps].r[1] == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = 0x80 - (xqd[1] + iVar5);
    }
  }
  if (0 < height) {
    local_70 = (ushort *)((long)dat8 * 2);
    local_78 = (undefined2 *)((long)dst8 * 2);
    local_8c = 0;
    uVar8 = 0;
    local_80 = dat8;
    do {
      if (0 < width) {
        iVar2 = av1_sgr_params[eps].r[1];
        uVar6 = 0;
        puVar4 = local_78;
        puVar12 = local_70;
        do {
          if (highbd == 0) {
            uVar9 = (ushort)local_80[uVar6];
          }
          else {
            uVar9 = *puVar12;
          }
          iVar10 = (uint)uVar9 * 0x800;
          if (0 < iVar1) {
            iVar10 = iVar10 + (tmpbuf[local_8c + uVar6] + (uint)uVar9 * -0x10) * iVar5;
          }
          if (0 < iVar2) {
            iVar10 = iVar10 + (tmpbuf[(ulong)local_8c + uVar6 + 0x27734] + (uint)uVar9 * -0x10) *
                              iVar7;
          }
          uVar11 = iVar10 * 0x20 + 0x8000 >> 0x10;
          uVar13 = uVar11;
          if (bit_depth == 10) {
            if (0x3fe < uVar11) {
              uVar13 = 0x3ff;
            }
          }
          else if (bit_depth == 0xc) {
            if (0xffe < uVar11) {
              uVar13 = 0xfff;
            }
          }
          else if (0xfe < uVar11) {
            uVar13 = 0xff;
          }
          uVar3 = (short)uVar13;
          if ((int)uVar11 < 0) {
            uVar3 = 0;
          }
          if (highbd == 0) {
            dst8[uVar6] = (uint8_t)uVar3;
          }
          else {
            *puVar4 = uVar3;
          }
          uVar6 = uVar6 + 1;
          puVar12 = puVar12 + 1;
          puVar4 = puVar4 + 1;
        } while ((uint)width != uVar6);
      }
      uVar8 = uVar8 + 1;
      local_8c = local_8c + width;
      local_70 = local_70 + stride;
      local_80 = local_80 + stride;
      local_78 = local_78 + dst_stride;
      dst8 = dst8 + dst_stride;
    } while (uVar8 != (uint)height);
  }
  return 0;
}

Assistant:

int av1_apply_selfguided_restoration_c(const uint8_t *dat8, int width,
                                       int height, int stride, int eps,
                                       const int *xqd, uint8_t *dst8,
                                       int dst_stride, int32_t *tmpbuf,
                                       int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);

  const int ret = av1_selfguided_restoration_c(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);
  for (int i = 0; i < height; ++i) {
    for (int j = 0; j < width; ++j) {
      const int k = i * width + j;
      uint8_t *dst8ij = dst8 + i * dst_stride + j;
      const uint8_t *dat8ij = dat8 + i * stride + j;

      const uint16_t pre_u = highbd ? *CONVERT_TO_SHORTPTR(dat8ij) : *dat8ij;
      const int32_t u = (int32_t)pre_u << SGRPROJ_RST_BITS;
      int32_t v = u << SGRPROJ_PRJ_BITS;
      // If params->r == 0 then we skipped the filtering in
      // av1_selfguided_restoration_c, i.e. flt[k] == u
      if (params->r[0] > 0) v += xq[0] * (flt0[k] - u);
      if (params->r[1] > 0) v += xq[1] * (flt1[k] - u);
      const int16_t w =
          (int16_t)ROUND_POWER_OF_TWO(v, SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      const uint16_t out = clip_pixel_highbd(w, bit_depth);
      if (highbd)
        *CONVERT_TO_SHORTPTR(dst8ij) = out;
      else
        *dst8ij = (uint8_t)out;
    }
  }
  return 0;
}